

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pragma_table_info.cpp
# Opt level: O2

void duckdb::PragmaShowHelper::GetTableColumns
               (ColumnDefinition *column,ColumnConstraintInfo constraint_info,DataChunk *output,
               idx_t index)

{
  string *psVar1;
  LogicalType *this;
  char *pcVar2;
  Value key;
  LogicalType local_d8;
  Value local_c0;
  LogicalType local_80;
  string local_68;
  string local_48;
  
  psVar1 = ColumnDefinition::Name_abi_cxx11_(column);
  ::std::__cxx11::string::string((string *)&local_48,(string *)psVar1);
  Value::Value(&key,&local_48);
  DataChunk::SetValue(output,0,index,&key);
  Value::~Value(&key);
  ::std::__cxx11::string::~string((string *)&local_48);
  this = ColumnDefinition::Type(column);
  LogicalType::ToString_abi_cxx11_(&local_68,this);
  Value::Value(&key,(string *)&local_68);
  DataChunk::SetValue(output,1,index,&key);
  Value::~Value(&key);
  ::std::__cxx11::string::~string((string *)&local_68);
  pcVar2 = "YES";
  if (((uint3)constraint_info & 1) != 0) {
    pcVar2 = "NO";
  }
  Value::Value(&key,pcVar2);
  DataChunk::SetValue(output,2,index,&key);
  Value::~Value(&key);
  LogicalType::LogicalType(&local_80,SQLNULL);
  Value::Value(&key,&local_80);
  LogicalType::~LogicalType(&local_80);
  if (((uint3)constraint_info >> 8 & 1) == 0) {
    if (((uint3)constraint_info >> 0x10 & 1) == 0) goto LAB_0157b9b7;
    pcVar2 = "UNI";
  }
  else {
    pcVar2 = "PRI";
  }
  Value::Value(&local_c0,pcVar2);
  Value::operator=(&key,&local_c0);
  Value::~Value(&local_c0);
LAB_0157b9b7:
  DataChunk::SetValue(output,3,index,&key);
  DefaultValue(&local_c0,column);
  DataChunk::SetValue(output,4,index,&local_c0);
  Value::~Value(&local_c0);
  LogicalType::LogicalType(&local_d8,SQLNULL);
  Value::Value(&local_c0,&local_d8);
  DataChunk::SetValue(output,5,index,&local_c0);
  Value::~Value(&local_c0);
  LogicalType::~LogicalType(&local_d8);
  Value::~Value(&key);
  return;
}

Assistant:

static void GetTableColumns(const ColumnDefinition &column, ColumnConstraintInfo constraint_info, DataChunk &output,
	                            idx_t index) {
		// "column_name", PhysicalType::VARCHAR
		output.SetValue(0, index, Value(column.Name()));
		// "column_type", PhysicalType::VARCHAR
		output.SetValue(1, index, Value(column.Type().ToString()));
		// "null", PhysicalType::VARCHAR
		output.SetValue(2, index, Value(constraint_info.not_null ? "NO" : "YES"));
		// "key", PhysicalType::VARCHAR
		Value key;
		if (constraint_info.pk || constraint_info.unique) {
			key = Value(constraint_info.pk ? "PRI" : "UNI");
		}
		output.SetValue(3, index, key);
		// "default", VARCHAR
		output.SetValue(4, index, DefaultValue(column));
		// "extra", VARCHAR
		output.SetValue(5, index, Value());
	}